

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::RepeatedImmutablePrimitiveFieldGenerator::GenerateInterfaceMembers
          (RepeatedImmutablePrimitiveFieldGenerator *this,Printer *printer)

{
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *vars;
  FieldDescriptor *pFVar1;
  string_view text;
  string_view text_00;
  string_view text_01;
  Options local_118;
  Options local_c8;
  Options local_78;
  
  pFVar1 = (this->super_ImmutablePrimitiveFieldGenerator).descriptor_;
  Options::Options(&local_78,&((this->super_ImmutablePrimitiveFieldGenerator).context_)->options_);
  WriteFieldAccessorDocComment(printer,pFVar1,LIST_GETTER,&local_78,false,false,false);
  Options::~Options(&local_78);
  vars = &(this->super_ImmutablePrimitiveFieldGenerator).variables_;
  text._M_str = "$deprecation$java.util.List<$boxed_type$> get$capitalized_name$List();\n";
  text._M_len = 0x47;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text);
  pFVar1 = (this->super_ImmutablePrimitiveFieldGenerator).descriptor_;
  Options::Options(&local_c8,&((this->super_ImmutablePrimitiveFieldGenerator).context_)->options_);
  WriteFieldAccessorDocComment(printer,pFVar1,LIST_COUNT,&local_c8,false,false,false);
  Options::~Options(&local_c8);
  text_00._M_str = "$deprecation$int get$capitalized_name$Count();\n";
  text_00._M_len = 0x2f;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_00);
  pFVar1 = (this->super_ImmutablePrimitiveFieldGenerator).descriptor_;
  Options::Options(&local_118,&((this->super_ImmutablePrimitiveFieldGenerator).context_)->options_);
  WriteFieldAccessorDocComment(printer,pFVar1,LIST_INDEXED_GETTER,&local_118,false,false,false);
  Options::~Options(&local_118);
  text_01._M_str = "$deprecation$$type$ get$capitalized_name$(int index);\n";
  text_01._M_len = 0x36;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_01);
  return;
}

Assistant:

void RepeatedImmutablePrimitiveFieldGenerator::GenerateInterfaceMembers(
    io::Printer* printer) const {
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_GETTER,
                               context_->options());
  printer->Print(variables_,
                 "$deprecation$java.util.List<$boxed_type$> "
                 "get$capitalized_name$List();\n");
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_COUNT,
                               context_->options());
  printer->Print(variables_,
                 "$deprecation$int get$capitalized_name$Count();\n");
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_INDEXED_GETTER,
                               context_->options());
  printer->Print(variables_,
                 "$deprecation$$type$ get$capitalized_name$(int index);\n");
}